

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition
               (sysbvm_context_t *context,sysbvm_functionDefinition_t *definition_)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar2;
  anon_struct_8_2_b06356a8_for_anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0_1 aVar3;
  undefined4 uVar4;
  _Bool _Var5;
  byte bVar6;
  char cVar7;
  byte bVar8;
  size_t i;
  ulong uVar9;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar10;
  size_t sVar11;
  sysbvm_tuple_t sVar12;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  uint uVar16;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand_1;
  sysbvm_tuple_t sVar17;
  long lVar18;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand;
  ulong uVar19;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar20;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand_2;
  size_t sVar21;
  sysbvm_functionBytecodeAssembler_t *psVar22;
  long lVar23;
  ulong uVar24;
  sysbvm_functionBytecodeAssembler_t *psVar25;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar26;
  uint uVar27;
  sysbvm_functionBytecodeAssemblerInstruction_t *bytecodeInstruction;
  uint64_t value;
  long lVar28;
  int64_t svalue_1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar29;
  sysbvm_tuple_t *psVar30;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar31;
  bool bVar32;
  sysbvm_functionDefinition_t *local_b8;
  sysbvm_tuple_t sStack_b0;
  sysbvm_functionBytecodeDirectCompiler_t *local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_object_tuple_t *local_98;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **local_78;
  sysbvm_functionBytecodeAssembler_t *local_70;
  sysbvm_tuple_t local_68;
  long local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_functionDefinition_t **ppsStack_40;
  
  ppsStack_40 = &local_b8;
  sStack_b0 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = (sysbvm_object_tuple_t *)0x0;
  psStack_90 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
  local_a8 = (sysbvm_functionBytecodeDirectCompiler_t *)0x0;
  sStack_a0 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 8;
  local_b8 = definition_;
  sysbvm_stackFrame_pushRecord(&local_58);
  sStack_b0 = local_b8->sourceAnalyzedDefinition;
  local_a8 = (sysbvm_functionBytecodeDirectCompiler_t *)
             sysbvm_functionBytecodeDirectCompiler_create(context);
  psVar25 = local_a8->assembler;
  psVar25->sourceEnvironment = *(sysbvm_tuple_t *)(sStack_b0 + 0x18);
  psVar25->sourcePosition = *(sysbvm_tuple_t *)(sStack_b0 + 0x10);
  uVar9 = *(ulong *)(sStack_b0 + 0x28);
  if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
    sVar11 = (size_t)(*(uint *)(uVar9 + 0xc) >> 3);
  }
  else {
    sVar11 = 0;
  }
  sysbvm_functionBytecodeAssembler_setArgumentCount(context,psVar25,sVar11);
  if (sVar11 != 0) {
    sVar21 = 0;
    do {
      uVar9 = *(ulong *)(sStack_b0 + 0x28);
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sVar12 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar21 * 8);
      }
      else {
        sVar12 = 0;
      }
      uVar9 = local_a8->assembler->arguments;
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sVar17 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar21 * 8);
      }
      else {
        sVar17 = 0;
      }
      sysbvm_methodDictionary_atPut(context,local_a8->bindingDictionary,sVar12,sVar17);
      sVar21 = sVar21 + 1;
    } while (sVar11 != sVar21);
  }
  uVar9 = *(ulong *)(sStack_b0 + 0x20);
  if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
    sVar11 = (size_t)(*(uint *)(uVar9 + 0xc) >> 3);
  }
  else {
    sVar11 = 0;
  }
  sysbvm_functionBytecodeAssembler_setCaptureCount(context,local_a8->assembler,sVar11);
  if (sVar11 != 0) {
    sVar21 = 0;
    do {
      uVar9 = *(ulong *)(sStack_b0 + 0x20);
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sVar12 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar21 * 8);
      }
      else {
        sVar12 = 0;
      }
      uVar9 = local_a8->assembler->captures;
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sVar17 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar21 * 8);
      }
      else {
        sVar17 = 0;
      }
      sysbvm_methodDictionary_atPut(context,local_a8->bindingDictionary,sVar12,sVar17);
      sVar21 = sVar21 + 1;
    } while (sVar11 != sVar21);
  }
  if (*(sysbvm_tuple_t *)(sStack_b0 + 0x48) == 0) {
    sStack_a0 = sysbvm_functionBytecodeAssembler_addLiteral(context,local_a8->assembler,0x2f);
  }
  else {
    sStack_a0 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,local_a8,*(sysbvm_tuple_t *)(sStack_b0 + 0x48));
  }
  if (sStack_a0 != 0) {
    sysbvm_functionBytecodeAssembler_return(context,local_a8->assembler,sStack_a0);
  }
  psVar25 = local_a8->assembler;
  if (psVar25->firstInstruction != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    psVar29 = psVar25->firstInstruction;
    do {
      psVar26 = psVar29->next;
      _Var5 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar29);
      if (((!_Var5) &&
          (uVar9 = psVar29[1].super.header.field_0.typePointer >> 4, (byte)uVar9 < 0x27)) &&
         ((0x6000020000U >> (uVar9 & 0x3f) & 1) != 0)) {
        uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
        if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
          psVar10 = *(sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)
                     (uVar9 + 0x10 + ((ulong)(*(uint *)(uVar9 + 0xc) >> 3) - 1) * 8);
        }
        else {
          psVar10 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0;
        }
        if (psVar10 == psVar26) {
          psVar10 = psVar29->previous;
          psVar1 = psVar29->next;
          ppsVar31 = &psVar10->next;
          if (psVar10 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
            ppsVar31 = &psVar25->firstInstruction;
          }
          *ppsVar31 = psVar1;
          ppsVar31 = &psVar1->previous;
          if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
            ppsVar31 = &psVar25->lastInstruction;
          }
          *ppsVar31 = psVar10;
        }
      }
      psVar29 = psVar26;
    } while (psVar26 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
  }
  psVar25 = local_a8->assembler;
  sVar11 = sysbvm_orderedCollection_getSize(psVar25->temporaries);
  if (sVar11 != 0) {
    sVar21 = 0;
    do {
      sVar12 = sysbvm_orderedCollection_at(psVar25->temporaries,sVar21);
      *(undefined8 *)(sVar12 + 0x20) = 0xf;
      *(undefined8 *)(sVar12 + 0x28) = 0xf;
      *(undefined8 *)(sVar12 + 0x30) = 0xf;
      *(undefined8 *)(sVar12 + 0x38) = 0xf;
      *(undefined8 *)(sVar12 + 0x40) = 0xf;
      *(undefined8 *)(sVar12 + 0x48) = 0xf;
      sVar21 = sVar21 + 1;
    } while (sVar11 != sVar21);
  }
  psVar29 = psVar25->firstInstruction;
  ppsVar31 = &psVar25->firstInstruction;
  for (; local_78 = ppsVar31, local_70 = psVar25,
      psVar29 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
      psVar29 = psVar29->next) {
    _Var5 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar29);
    if (!_Var5) {
      uVar27 = psVar29[1].super.header.field_0.field_1.typePointer32 >> 4;
      bVar8 = (byte)uVar27;
      if (bVar8 != 0x1f) {
        bVar6 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar8);
        uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
        bVar32 = (uVar9 & 0xf) != 0;
        if (bVar32 || uVar9 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (ulong)(*(uint *)(uVar9 + 0xc) >> 3);
        }
        if ((bVar8 < 0x27) && ((0x6000020000U >> ((ulong)(uVar27 & 0xff) & 0x3f) & 1) != 0)) {
          uVar19 = uVar19 - 1;
        }
        uVar13 = (ulong)bVar6;
        if (bVar6 != 0) {
          uVar24 = 0;
          do {
            if (bVar32 || uVar9 == 0) {
              lVar23 = 0;
            }
            else {
              lVar23 = *(long *)(uVar9 + 0x10 + uVar24 * 8);
            }
            if (lVar23 != 0) {
              *(undefined8 *)(lVar23 + (ulong)((bVar8 & 0xef) != 0x20) * 8 + 0x20) = 0x1f;
              *(undefined8 *)(lVar23 + (ulong)(bVar8 != 0x37) * 8 + 0x30) = 0x1f;
            }
            uVar24 = uVar24 + 1;
          } while (uVar13 != uVar24);
        }
        if (uVar13 < uVar19) {
          do {
            lVar23 = (ulong)(uVar13 != 0) * 8 + 0x40;
            if (bVar8 != 0x24) {
              lVar23 = 0x48;
            }
            if (bVar8 == 0x22) {
              lVar23 = 0x40;
            }
            *(undefined8 *)(*(long *)(uVar9 + 0x10 + uVar13 * 8) + lVar23) = 0x1f;
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
        }
      }
    }
    psVar25 = local_70;
    ppsVar31 = local_78;
  }
  psVar26 = *ppsVar31;
joined_r0x0014ed8d:
  while( true ) {
    do {
      psVar29 = psVar26;
      if (psVar29 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
        sVar11 = sysbvm_orderedCollection_getSize(local_a8->assembler->temporaries);
        if (sVar11 + 0x800000000000000 >> 0x3c == 0) {
          uVar9 = sVar11 << 4 | 0xb;
        }
        else {
          uVar9 = sysbvm_tuple_uint64_encodeBig(context,sVar11);
        }
        local_a8->assembler->usedTemporaryCount = uVar9;
        local_98 = sysbvm_context_allocatePointerTuple
                             (context,(context->roots).functionBytecodeType,0x12);
        uVar9 = local_a8->assembler->arguments;
        sVar12 = 0xb;
        sVar17 = 0xb;
        if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
          sVar17 = (ulong)(*(uint *)(uVar9 + 0xc) >> 3) << 4 | 0xb;
        }
        (local_98->field_1).pointers[0] = sVar17;
        uVar9 = local_a8->assembler->captures;
        if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
          sVar12 = (ulong)(*(uint *)(uVar9 + 0xc) >> 3) << 4 | 0xb;
        }
        local_98[1].header.field_0.typePointer = sVar12;
        psVar25 = local_a8->assembler;
        uVar4 = *(undefined4 *)((long)&psVar25->usedTemporaryCount + 4);
        local_98[1].header.identityHashAndFlags = *(undefined4 *)&psVar25->usedTemporaryCount;
        local_98[1].header.objectSize = uVar4;
        sVar12 = sysbvm_orderedCollection_asArray(context,psVar25->literals);
        local_98[1].field_1.pointers[0] = sVar12;
        *(sysbvm_functionDefinition_t **)&local_98[2].header.identityHashAndFlags = local_b8;
        local_98[2].field_1 =
             *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(sStack_b0 + 0x28);
        local_98[3].header.field_0 =
             *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(sStack_b0 + 0x20);
        sVar12 = sysbvm_orderedCollection_asArray(context,local_a8->assembler->temporaryTypes);
        local_98[3].header.identityHashAndFlags = (int)sVar12;
        local_98[3].header.objectSize = (int)(sVar12 >> 0x20);
        local_98[4].field_1.pointers[0] = 0xc;
        local_98[5].header.field_0.typePointer = 0xc;
        local_98[5].header.identityHashAndFlags = 0xc;
        local_98[5].header.objectSize = 0;
        local_98[5].field_1.pointers[0] = 0xc;
        local_98[6].header.field_0.typePointer = 0xc;
        local_98[6].header.identityHashAndFlags = 0xc;
        local_98[6].header.objectSize = 0;
        local_98[3].field_1 =
             *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(sStack_b0 + 0x10);
        local_88 = sysbvm_orderedOffsetTableBuilder_create(context);
        sStack_80 = sysbvm_orderedOffsetTableBuilder_create(context);
        psStack_90 = local_a8->assembler->firstInstruction;
        if (psStack_90 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
          sVar12 = 0;
        }
        else {
          value = 0;
          do {
            if (value + 0x800000000000000 < 0x1000000000000000) {
              uVar9 = value << 4 | 0xb;
            }
            else {
              uVar9 = sysbvm_tuple_uint64_encodeBig(context,value);
            }
            psVar29 = psStack_90;
            psStack_90->pc = uVar9;
            _Var5 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psStack_90);
            if (_Var5) {
              uVar19 = 0;
            }
            else {
              uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
              uVar19 = 1;
              if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
                uVar19 = (ulong)(*(uint *)(uVar9 + 0xc) >> 2) | 1;
              }
            }
            sVar12 = uVar19 + value;
            if (sVar12 + 0x800000000000000 < 0x1000000000000000) {
              uVar9 = sVar12 * 0x10 | 0xb;
            }
            else {
              uVar9 = sysbvm_tuple_uint64_encodeBig(context,sVar12);
            }
            psStack_90->endPC = uVar9;
            sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                      (context,local_88,(uint32_t)value,psStack_90->sourcePosition);
            sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                      (context,sStack_80,(uint32_t)value,psStack_90->sourceEnvironment);
            psStack_90 = psStack_90->next;
            value = sVar12;
          } while (psStack_90 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0);
        }
        psStack_90 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
        local_68 = sysbvm_byteArray_create(context,sVar12);
        local_98[2].header.field_0.typePointer = local_68;
        psVar26 = local_a8->assembler->firstInstruction;
        psStack_90 = psVar26;
        if (psVar26 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
          local_60 = local_68 + 0x12;
          ppsVar31 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)0x0;
          do {
            psStack_90 = psVar26;
            _Var5 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar26);
            local_78 = ppsVar31;
            if (_Var5) {
              lVar28 = 0;
            }
            else {
              uVar9 = *(ulong *)&psVar26[1].super.header.identityHashAndFlags;
              if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
                psVar25 = (sysbvm_functionBytecodeAssembler_t *)(ulong)(*(uint *)(uVar9 + 0xc) >> 3)
                ;
              }
              else {
                psVar25 = (sysbvm_functionBytecodeAssembler_t *)0x0;
              }
              aVar3 = psVar26[1].super.header.field_0.field_1;
              bVar8 = (byte)((ulong)aVar3 >> 4);
              bVar6 = bVar8;
              if (0x3f < bVar8) {
                sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
                bVar6 = sysbvm_implicitVariableBytecodeOperandCountTable
                        [aVar3.typePointer32 >> 8 & 0xf];
                if ((uint)psVar25 < (uint)bVar6) {
                  sysbvm_error_assertionFailure
                            (
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:770: assertion failure: operandCount >= implicitOperandCount"
                            );
                }
                bVar6 = ((byte)((long)psVar25 - (ulong)bVar6 >> (bVar8 == 0xe0)) & 0xf) + bVar8;
              }
              *(byte *)(local_68 + 0x10 + (long)ppsVar31) = bVar6;
              bVar8 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar8);
              lVar23 = local_60;
              if (psVar25 == (sysbvm_functionBytecodeAssembler_t *)0x0) {
                lVar28 = 1;
              }
              else {
                local_70 = (sysbvm_functionBytecodeAssembler_t *)(ulong)bVar8;
                lVar28 = 1;
                psVar22 = (sysbvm_functionBytecodeAssembler_t *)0x0;
                do {
                  uVar9 = *(ulong *)&psVar26[1].super.header.identityHashAndFlags;
                  if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
                    psVar30 = *(sysbvm_tuple_t **)(uVar9 + 0x10 + (long)psVar22 * 8);
                  }
                  else {
                    psVar30 = (sysbvm_tuple_t *)0x0;
                  }
                  if (psVar30 == (sysbvm_tuple_t *)0x0) {
                    if (local_70 <= psVar22) {
                      sysbvm_error("Invalid missing non-destination operand.");
                    }
                    *(undefined2 *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23 + -1) = 0xffff;
                  }
                  else {
                    uVar9 = (ulong)((uint)psVar30 & 0xf);
                    if (uVar9 == 0xf) {
                      sVar12 = sysbvm_tuple_getImmediateTrivialTypeWithIndex
                                         (context,(ulong)psVar30 >> 4);
                    }
                    else if (uVar9 == 0) {
                      sVar12 = *psVar30;
                    }
                    else {
                      sVar12 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar9);
                    }
                    if ((sVar12 == (context->roots).functionBytecodeAssemblerInstruction) ||
                       (sVar12 == (context->roots).functionBytecodeAssemblerLabel)) {
                      uVar9 = psVar30[2];
                      if (uVar9 == 0 || (uVar9 & 0xf) != 0) {
                        lVar15 = (long)uVar9 >> 4;
                      }
                      else {
                        lVar15 = *(long *)(uVar9 + 0x10);
                      }
                      uVar9 = psVar26->endPC;
                      if (uVar9 == 0 || (uVar9 & 0xf) != 0) {
                        lVar18 = (long)uVar9 >> 4;
                      }
                      else {
                        lVar18 = *(long *)(uVar9 + 0x10);
                      }
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23 + -1) =
                           (char)(lVar15 - lVar18);
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23) =
                           (char)((ulong)(lVar15 - lVar18) >> 8);
                    }
                    else if (sVar12 == (context->roots).functionBytecodeAssemblerVectorOperand) {
                      uVar27 = (uint)psVar30[2] >> 2 & 0xfffffffc | (uint)psVar30[3] >> 4;
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23 + -1) = (char)uVar27;
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23) = (char)(uVar27 >> 8);
                    }
                    else {
                      if (sVar12 != (context->roots).int16Type) {
                        abort();
                      }
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23 + -1) =
                           (char)((ulong)psVar30 >> 4);
                      *(char *)((long)ppsVar31 + (long)psVar22 * 2 + lVar23) =
                           (char)((uint)psVar30 >> 0xc);
                    }
                  }
                  lVar28 = lVar28 + 2;
                  psVar22 = (sysbvm_functionBytecodeAssembler_t *)
                            ((long)&(psVar22->header).field_0.typePointer + 1);
                } while (psVar25 != psVar22);
              }
            }
            ppsVar31 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)
                       ((long)local_78 + lVar28);
            psVar26 = psStack_90->next;
            psStack_90 = psVar26;
          } while (psVar26 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
        }
        local_b8->bytecode = (sysbvm_tuple_t)local_98;
        local_b8->sourceAnalyzedDefinition = 0;
        sVar12 = sysbvm_orderedOffsetTableBuilder_finish(context,local_88);
        local_98[4].header.field_0.typePointer = sVar12;
        sVar12 = sysbvm_orderedOffsetTableBuilder_finish(context,sStack_80);
        local_98[4].header.identityHashAndFlags = (int)sVar12;
        local_98[4].header.objectSize = (int)(sVar12 >> 0x20);
        return;
      }
      psVar26 = psVar29->next;
      _Var5 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar29);
    } while (_Var5);
    uVar9 = psVar29[1].super.header.field_0.typePointer >> 4;
    cVar7 = (char)uVar9;
    uVar27 = (uint)uVar9;
    uVar16 = uVar27 & 0xff;
    if (0x23 < uVar16) break;
    if (uVar16 != 0x20) goto LAB_0014ef2f;
    lVar23 = *(long *)&psVar29[1].super.header.identityHashAndFlags;
    lVar28 = *(long *)(lVar23 + 0x10);
    if ((((*(long *)(lVar28 + 0x20) == 0x1f) && (*(long *)(lVar28 + 0x28) != 0x1f)) &&
        (*(long *)(lVar28 + 0x40) == 0x1f)) && (*(long *)(lVar28 + 0x48) != 0x1f)) {
      psVar29[1].super.header.field_0.typePointer = 0x213;
      sVar12 = sysbvm_functionBytecodeAssembler_addLiteral(context,psVar25,0);
      if (lVar23 != 0) {
        *(sysbvm_tuple_t *)(lVar23 + 0x18) = sVar12;
      }
      uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sVar12 = *(sysbvm_tuple_t *)(uVar9 + 0x10);
      }
      else {
        sVar12 = 0;
      }
      sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar25,sVar12);
    }
    else {
      uVar16 = uVar27 & 0xff;
      if (0x2f < uVar16) {
        if (uVar16 != 0x37) goto code_r0x0014f08a;
        goto LAB_0014eee6;
      }
      if (uVar16 == 0x22) goto LAB_0014ef38;
      if (uVar16 == 0x24) goto LAB_0014efd6;
    }
  }
  if (uVar16 != 0x24) {
    if (uVar16 == 0x30) goto LAB_0014eddc;
    goto LAB_0014eedd;
  }
  goto LAB_0014efd6;
code_r0x0014f08a:
  if (uVar16 != 0x30) goto joined_r0x0014ed8d;
LAB_0014eddc:
  sVar12 = *(sysbvm_tuple_t *)(*(long *)&psVar29[1].super.header.identityHashAndFlags + 0x10);
  if (((*(long *)(sVar12 + 0x20) == 0x1f) && (*(long *)(sVar12 + 0x28) != 0x1f)) &&
     ((*(long *)(sVar12 + 0x40) == 0x1f && (*(long *)(sVar12 + 0x48) != 0x1f)))) {
    sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar25,sVar12);
    sVar12 = sysbvm_array_create(context,2);
    uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      uVar14 = *(undefined8 *)(uVar9 + 0x10);
    }
    else {
      uVar14 = 0;
    }
    bVar32 = (sVar12 & 0xf) == 0;
    if (bVar32 && sVar12 != 0) {
      *(undefined8 *)(sVar12 + 0x10) = uVar14;
    }
    uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      uVar14 = *(undefined8 *)(uVar9 + 0x20);
    }
    else {
      uVar14 = 0;
    }
    if (bVar32 && sVar12 != 0) {
      *(undefined8 *)(sVar12 + 0x18) = uVar14;
    }
    psVar29[1].super.header.field_0.typePointer = 0x213;
    goto LAB_0014f126;
  }
  if (cVar7 == '\"') {
LAB_0014ef38:
    lVar23 = *(long *)(*(long *)&psVar29[1].super.header.identityHashAndFlags + 0x18);
    if ((((*(long *)(lVar23 + 0x20) == 0x1f) && (*(long *)(lVar23 + 0x28) != 0x1f)) &&
        (*(long *)(lVar23 + 0x40) == 0x1f)) && (*(long *)(lVar23 + 0x48) != 0x1f))
    goto LAB_0014effa;
    if (((*(long *)(lVar23 + 0x30) == 0x1f) && (*(long *)(lVar23 + 0x38) != 0x1f)) &&
       ((*(long *)(lVar23 + 0x40) == 0x1f && (*(long *)(lVar23 + 0x48) != 0x1f)))) {
      sVar12 = sysbvm_array_create(context,3);
      uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        uVar14 = *(undefined8 *)(uVar9 + 0x10);
      }
      else {
        uVar14 = 0;
      }
      if ((sVar12 & 0xf) == 0 && sVar12 != 0) {
        *(undefined8 *)(sVar12 + 0x10) = uVar14;
        *(undefined8 *)(sVar12 + 0x18) = *(undefined8 *)(lVar23 + 0x58);
        *(undefined8 *)(sVar12 + 0x20) = *(undefined8 *)(lVar23 + 0x60);
      }
      psVar29[1].super.header.field_0.typePointer = 0x363;
      goto LAB_0014f126;
    }
    if (cVar7 != '$') goto joined_r0x0014ed8d;
  }
  else if ((uVar27 & 0xff) != 0x24) {
LAB_0014eedd:
    if ((uVar27 & 0xff) != 0x37) goto joined_r0x0014ed8d;
LAB_0014eee6:
    lVar23 = *(long *)&psVar29[1].super.header.identityHashAndFlags;
    lVar28 = *(long *)(lVar23 + 0x10);
    if (((*(long *)(lVar28 + 0x30) == 0x1f) && (*(long *)(lVar28 + 0x38) != 0x1f)) &&
       ((*(long *)(lVar28 + 0x40) == 0x1f && (*(long *)(lVar28 + 0x48) != 0x1f)))) {
      if (lVar23 == 0) {
        *(undefined8 *)(lVar28 + 0x58) = 0;
        uVar14 = 0;
      }
      else {
        *(undefined8 *)(lVar28 + 0x58) = *(undefined8 *)(lVar23 + 0x18);
        uVar14 = *(undefined8 *)(lVar23 + 0x20);
      }
      *(undefined8 *)(lVar28 + 0x60) = uVar14;
      psVar2 = psVar29->previous;
      psVar10 = psVar29->next;
      ppsVar20 = &psVar2->next;
      if (psVar2 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
        ppsVar20 = ppsVar31;
      }
      *ppsVar20 = psVar10;
      if (psVar10 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
        psVar25->lastInstruction = psVar2;
      }
      else {
        psVar10->previous = psVar2;
      }
      goto joined_r0x0014ed8d;
    }
    if (cVar7 != '$') {
LAB_0014ef2f:
      if ((uVar27 & 0xff) != 0x22) goto joined_r0x0014ed8d;
      goto LAB_0014ef38;
    }
  }
LAB_0014efd6:
  lVar23 = *(long *)(*(long *)&psVar29[1].super.header.identityHashAndFlags + 0x10);
  if (((*(long *)(lVar23 + 0x20) != 0x1f) || (*(long *)(lVar23 + 0x28) == 0x1f)) ||
     ((*(long *)(lVar23 + 0x40) != 0x1f || (*(long *)(lVar23 + 0x48) == 0x1f)))) {
    if ((((*(long *)(lVar23 + 0x30) != 0x1f) || (*(long *)(lVar23 + 0x38) == 0x1f)) ||
        (*(long *)(lVar23 + 0x40) != 0x1f)) || (*(long *)(lVar23 + 0x48) == 0x1f))
    goto joined_r0x0014ed8d;
    sVar12 = sysbvm_array_create(context,3);
    bVar32 = (sVar12 & 0xf) == 0;
    if (bVar32 && sVar12 != 0) {
      *(undefined8 *)(sVar12 + 0x10) = *(undefined8 *)(lVar23 + 0x58);
      *(undefined8 *)(sVar12 + 0x18) = *(undefined8 *)(lVar23 + 0x60);
    }
    uVar9 = *(ulong *)&psVar29[1].super.header.identityHashAndFlags;
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      uVar14 = *(undefined8 *)(uVar9 + 0x18);
    }
    else {
      uVar14 = 0;
    }
    if (bVar32 && sVar12 != 0) {
      *(undefined8 *)(sVar12 + 0x20) = uVar14;
    }
    psVar29[1].super.header.field_0.typePointer = 899;
LAB_0014f126:
    psVar29[1].super.header.identityHashAndFlags = (int)sVar12;
    psVar29[1].super.header.objectSize = (int)(sVar12 >> 0x20);
    goto joined_r0x0014ed8d;
  }
LAB_0014effa:
  psVar29[1].super.header.field_0.typePointer = 0x213;
  goto joined_r0x0014ed8d;
}

Assistant:

SYSBVM_API void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(sysbvm_context_t *context, sysbvm_functionDefinition_t *definition_)
{
    struct {
        sysbvm_functionDefinition_t *definition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t bodyResult;
        sysbvm_functionBytecode_t *bytecode;
        sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction;

        sysbvm_tuple_t debugSourcePositions;
        sysbvm_tuple_t debugSourceEnvironments;
    } gcFrame = {
        .definition = (sysbvm_functionDefinition_t*)definition_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.definition->sourceAnalyzedDefinition;

    gcFrame.compiler = (sysbvm_functionBytecodeDirectCompiler_t*)sysbvm_functionBytecodeDirectCompiler_create(context);
    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.sourceAnalyzedDefinition->environment;
    gcFrame.compiler->assembler->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;

    {
        // Make the argument operands.
        size_t argumentCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->arguments);
        sysbvm_functionBytecodeAssembler_setArgumentCount(context, gcFrame.compiler->assembler, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->arguments, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }

        // Make the binding operands.
        size_t captureCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->captures);
        sysbvm_functionBytecodeAssembler_setCaptureCount(context, gcFrame.compiler->assembler, captureCount);
        for(size_t i = 0; i < captureCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->captures, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->captures, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }
    }

    // Compile the body.
    gcFrame.bodyResult = gcFrame.sourceAnalyzedDefinition->bodyNode
        ? sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, gcFrame.sourceAnalyzedDefinition->bodyNode)
        : sysbvm_functionBytecodeAssembler_addLiteral(context, gcFrame.compiler->assembler, SYSBVM_VOID_TUPLE);

    if(gcFrame.bodyResult)
        sysbvm_functionBytecodeAssembler_return(context, gcFrame.compiler->assembler, gcFrame.bodyResult);

    // Perform some optimizations.
    sysbvm_functionBytecodeAssembler_optimizeJumps(context, gcFrame.compiler->assembler);
    sysbvm_functionBytecodeAssembler_optimizeTemporaries(context, gcFrame.compiler->assembler);
    
    // Assemble the instructions.
    gcFrame.compiler->assembler->usedTemporaryCount = sysbvm_tuple_size_encode(context, sysbvm_orderedCollection_getSize(gcFrame.compiler->assembler->temporaries));

    gcFrame.bytecode = (sysbvm_functionBytecode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecode_t));
    gcFrame.bytecode->argumentCount = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->arguments));
    gcFrame.bytecode->captureVectorSize = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->captures));
    gcFrame.bytecode->localVectorSize = gcFrame.compiler->assembler->usedTemporaryCount;
    gcFrame.bytecode->literalVector = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->literals);

    gcFrame.bytecode->definition = (sysbvm_tuple_t)gcFrame.definition;

    gcFrame.bytecode->arguments = gcFrame.sourceAnalyzedDefinition->arguments;
    gcFrame.bytecode->captures = gcFrame.sourceAnalyzedDefinition->captures;
    gcFrame.bytecode->temporaryTypes = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->temporaryTypes);

    gcFrame.bytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    gcFrame.bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    // Tables for the debug information.
    gcFrame.bytecode->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;
    gcFrame.debugSourcePositions = sysbvm_orderedOffsetTableBuilder_create(context);
    gcFrame.debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_create(context);

    // Assemble the instructions.
    size_t instructionsOffset = 0;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
    {
        size_t pc = instructionsOffset;
        gcFrame.instruction->pc = sysbvm_tuple_size_encode(context, instructionsOffset);
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_computeAssembledSize(context, gcFrame.instruction);
        gcFrame.instruction->endPC = sysbvm_tuple_size_encode(context, instructionsOffset);

        // Add the debug annotations.
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourcePositions, (uint32_t)pc, gcFrame.instruction->sourcePosition);
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourceEnvironments, (uint32_t)pc, gcFrame.instruction->sourceEnvironment);
    }

    gcFrame.bytecode->instructions = sysbvm_byteArray_create(context, instructionsOffset);
    instructionsOffset = 0;
    uint8_t *destInstructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(gcFrame.bytecode->instructions)->bytes;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_assembleInto(context, gcFrame.instruction, destInstructions + instructionsOffset);

    // Finish by installing it on the definition.
    gcFrame.definition->bytecode = (sysbvm_tuple_t)gcFrame.bytecode;
    gcFrame.definition->sourceAnalyzedDefinition = SYSBVM_NULL_TUPLE;

    gcFrame.bytecode->debugSourcePositions = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourcePositions);
    gcFrame.bytecode->debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourceEnvironments);
}